

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
::operator()(QuantileComposed<duckdb::MadAccessor<short,_short,_short>,_duckdb::QuantileIndirect<short>_>
             *this,idx_t *input)

{
  MadAccessor<short,_short,_short> *this_00;
  RESULT_TYPE_conflict RVar1;
  RESULT_TYPE_conflict local_a;
  
  this_00 = this->outer;
  local_a = QuantileIndirect<short>::operator()(this->inner,input);
  RVar1 = MadAccessor<short,_short,_short>::operator()(this_00,&local_a);
  return RVar1;
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}